

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O1

void __thiscall CppLogger::CppLogger::setFormat(CppLogger *this,Format *t_Format)

{
  pointer pFVar1;
  __normal_iterator<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
  _Var2;
  long lVar3;
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_70;
  undefined4 local_54;
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_50;
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_38;
  
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::vector
            (&local_50,&t_Format->m_Format);
  pFVar1 = local_50.
           super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::vector
            (&local_70,&t_Format->m_Format);
  local_54 = 4;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<CppLogger::FormatAttribute*,std::vector<CppLogger::FormatAttribute,std::allocator<CppLogger::FormatAttribute>>>,__gnu_cxx::__ops::_Iter_equals_val<CppLogger::FormatAttribute_const>>
                    (pFVar1,local_70.
                            super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::vector
            (&local_38,&t_Format->m_Format);
  if (local_38.
      super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.
      super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.
      super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (_Var2._M_current ==
      local_38.
      super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    Format::addMessage(t_Format);
  }
  lVar3 = 0;
  do {
    std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::operator=
              ((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
               (&this->field_0x28 + lVar3),&t_Format->m_Format);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x78);
  return;
}

Assistant:

void CppLogger::setFormat(Format& t_Format) {
        if (std::find(t_Format.getFormat().begin(), t_Format.getFormat().end(), FormatAttribute::Message) == t_Format.getFormat().end()) {
            t_Format.addMessage();
        }
        for (auto &format : m_Format) {
            format = t_Format;
        }
    }